

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O1

void __thiscall vec<vec<BoolView>_>::growTo(vec<vec<BoolView>_> *this,uint size)

{
  undefined8 *puVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  
  if (this->sz < size) {
    reserve(this,size);
    uVar2 = this->sz;
    if (uVar2 < size) {
      lVar4 = (ulong)size - (ulong)uVar2;
      lVar3 = (ulong)uVar2 << 4;
      do {
        puVar1 = (undefined8 *)((long)&this->data->sz + lVar3);
        *puVar1 = 0;
        puVar1[1] = 0;
        lVar3 = lVar3 + 0x10;
        lVar4 = lVar4 + -1;
      } while (lVar4 != 0);
    }
    this->sz = size;
  }
  return;
}

Assistant:

void growTo(unsigned int size) {
		if (size <= sz) {
			return;
		}
		reserve(size);
		for (unsigned int i = sz; i < size; i++) {
			new (&data[i]) T();
		}
		sz = size;
	}